

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equals<char16_t,char8_t>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  jessilib *pjVar1;
  jessilib *this;
  char32_t cVar2;
  char16_t *pcVar3;
  long lVar4;
  char8_t *pcVar5;
  size_t sVar6;
  decode_result dVar7;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  
  pcVar3 = lhs._M_str;
  sVar6 = lhs._M_len;
  pcVar5 = rhs._M_str;
  pjVar1 = (jessilib *)rhs._M_len;
  this = pjVar1;
  while( true ) {
    if ((sVar6 == 0) || (this == (jessilib *)0x0)) {
      return sVar6 == 0 && this == (jessilib *)0x0;
    }
    cVar2 = (char32_t)(ushort)*pcVar3;
    lVar4 = 1;
    if (((sVar6 != 1) && ((cVar2 & 0xfc00U) == 0xd800)) && (((ushort)pcVar3[1] & 0xfc00) == 0xdc00))
    {
      cVar2 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + L'\xfca02400';
      lVar4 = 2;
    }
    in_string._M_str = (char8_t *)pjVar1;
    in_string._M_len = (size_t)pcVar5;
    dVar7 = decode_codepoint_utf8<char8_t>(this,in_string);
    pjVar1 = (jessilib *)dVar7.units;
    if (cVar2 != dVar7.codepoint || pjVar1 == (jessilib *)0x0) break;
    pcVar3 = pcVar3 + lVar4;
    sVar6 = sVar6 - lVar4;
    pcVar5 = pcVar5 + (long)pjVar1;
    this = this + -(long)pjVar1;
  }
  return false;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}